

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SEES_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::SEES_PDU::SetPropulsionSystem
          (SEES_PDU *this,
          vector<KDIS::DATA_TYPE::PropulsionSystem,_std::allocator<KDIS::DATA_TYPE::PropulsionSystem>_>
          *PS)

{
  size_type sVar1;
  vector<KDIS::DATA_TYPE::PropulsionSystem,_std::allocator<KDIS::DATA_TYPE::PropulsionSystem>_>
  *PS_local;
  SEES_PDU *this_local;
  
  sVar1 = std::
          vector<KDIS::DATA_TYPE::PropulsionSystem,_std::allocator<KDIS::DATA_TYPE::PropulsionSystem>_>
          ::size(&this->m_vPropSys);
  (this->super_Header).super_Header6.m_ui16PDULength =
       (this->super_Header).super_Header6.m_ui16PDULength - (short)(sVar1 << 3);
  std::vector<KDIS::DATA_TYPE::PropulsionSystem,_std::allocator<KDIS::DATA_TYPE::PropulsionSystem>_>
  ::operator=(&this->m_vPropSys,PS);
  sVar1 = std::
          vector<KDIS::DATA_TYPE::PropulsionSystem,_std::allocator<KDIS::DATA_TYPE::PropulsionSystem>_>
          ::size(&this->m_vPropSys);
  this->m_ui16NumPropulsionSys = (KUINT16)sVar1;
  sVar1 = std::
          vector<KDIS::DATA_TYPE::PropulsionSystem,_std::allocator<KDIS::DATA_TYPE::PropulsionSystem>_>
          ::size(&this->m_vPropSys);
  (this->super_Header).super_Header6.m_ui16PDULength =
       (this->super_Header).super_Header6.m_ui16PDULength + (short)(sVar1 << 3);
  return;
}

Assistant:

void SEES_PDU::SetPropulsionSystem( const vector<PropulsionSystem> & PS )
{
    m_ui16PDULength -= PropulsionSystem::PROPULSION_SYSTEM_SIZE * m_vPropSys.size();
    m_vPropSys = PS;
    m_ui16NumPropulsionSys = m_vPropSys.size();
    m_ui16PDULength += m_vPropSys.size() * PropulsionSystem::PROPULSION_SYSTEM_SIZE;
}